

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YAMLParser.cpp
# Opt level: O0

bool __thiscall llvm::yaml::Document::skip(Document *this)

{
  bool bVar1;
  pointer this_00;
  Token local_58;
  Token *local_20;
  Token *T;
  Document *this_local;
  
  T = (Token *)this;
  this_00 = std::unique_ptr<llvm::yaml::Scanner,_std::default_delete<llvm::yaml::Scanner>_>::
            operator->(&this->stream->scanner);
  bVar1 = Scanner::failed(this_00);
  if (bVar1) {
    this_local._7_1_ = false;
  }
  else {
    if (this->Root == (Node *)0x0) {
      getRoot(this);
    }
    (*this->Root->_vptr_Node[1])();
    local_20 = peekNext(this);
    if (local_20->Kind == TK_StreamEnd) {
      this_local._7_1_ = false;
    }
    else if (local_20->Kind == TK_DocumentEnd) {
      getNext(&local_58,this);
      Token::~Token(&local_58);
      this_local._7_1_ = skip(this);
    }
    else {
      this_local._7_1_ = true;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool Document::skip()  {
  if (stream.scanner->failed())
    return false;
  if (!Root)
    getRoot();
  Root->skip();
  Token &T = peekNext();
  if (T.Kind == Token::TK_StreamEnd)
    return false;
  if (T.Kind == Token::TK_DocumentEnd) {
    getNext();
    return skip();
  }
  return true;
}